

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::dashtrailing(Forth *this)

{
  Char CVar1;
  uint uVar2;
  uint local_18;
  Char trailingChar;
  SCell count;
  CAddr caddr;
  Forth *this_local;
  
  requireDStackDepth(this,2,"COUNT");
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  local_18 = ForthStack<unsigned_int>::getTop(&this->dStack,0);
  while ((0 < (int)local_18 && (CVar1 = getDataChar(this,(uVar2 + local_18) - 1), CVar1 == ' '))) {
    local_18 = local_18 - 1;
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,local_18);
  return;
}

Assistant:

void dashtrailing() {
			REQUIRE_DSTACK_DEPTH(2, "COUNT");
			auto caddr = CADDR(dStack.getTop(1));
			SCell count = dStack.getTop(0);
			while(count>0){
			auto trailingChar = (getDataChar(caddr+count-1));
			if(trailingChar==' '){
				count--;
			} else {
				break;
			}
			}
			//Nothing done
			dStack.setTop(static_cast<Cell>(count));
		}